

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.h
# Opt level: O0

void __thiscall cmExportFileGenerator::~cmExportFileGenerator(cmExportFileGenerator *this)

{
  code *pcVar1;
  cmExportFileGenerator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmExportFileGenerator() = default;